

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_free(nk_context *ctx)

{
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x3a69,"void nk_free(struct nk_context *)");
  }
  if (ctx != (nk_context *)0x0) {
    nk_buffer_free(&ctx->memory);
    if (ctx->use_pool != 0) {
      nk_pool_free(&ctx->pool);
    }
    nk_zero(ctx,0x168);
    nk_zero(&ctx->style,0x1d78);
    nk_zero(&ctx->memory,0x78);
    ctx->seq = 0;
    ctx->build = 0;
    ctx->begin = (nk_window *)0x0;
    ctx->end = (nk_window *)0x0;
    ctx->active = (nk_window *)0x0;
    ctx->current = (nk_window *)0x0;
    ctx->freelist = (nk_page_element *)0x0;
    ctx->count = 0;
  }
  return;
}

Assistant:

NK_API void
nk_free(struct nk_context *ctx)
{
    NK_ASSERT(ctx);
    if (!ctx) return;
    nk_buffer_free(&ctx->memory);
    if (ctx->use_pool)
        nk_pool_free(&ctx->pool);

    nk_zero(&ctx->input, sizeof(ctx->input));
    nk_zero(&ctx->style, sizeof(ctx->style));
    nk_zero(&ctx->memory, sizeof(ctx->memory));

    ctx->seq = 0;
    ctx->build = 0;
    ctx->begin = 0;
    ctx->end = 0;
    ctx->active = 0;
    ctx->current = 0;
    ctx->freelist = 0;
    ctx->count = 0;
}